

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

CommandOptions * show_file_info(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  Dictionary *pDVar4;
  IFileReader *pIVar5;
  long *plVar6;
  IFileReaderFactory *in_RDX;
  SourcePackage *SP;
  Identification *ID;
  allocator<char> local_e51;
  string local_e50 [32];
  Result_t local_e30 [104];
  undefined1 local_dc8 [8];
  OP1aHeader TestHeader;
  Dictionary *Dict;
  mem_ptr<Kumu::IFileReader> Reader;
  undefined1 local_b38 [8];
  FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> wrapper_4;
  undefined1 local_9a0 [8];
  FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> wrapper_3;
  undefined1 local_800 [8];
  FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> wrapper_2;
  undefined1 local_650 [104];
  undefined1 local_5e8 [8];
  FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> wrapper_1;
  undefined1 local_348 [8];
  FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> wrapper;
  allocator<char> local_49;
  string local_48 [35];
  undefined1 local_25;
  undefined1 local_24 [8];
  EssenceType_t EssenceType;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  Result_t *result;
  
  local_25 = 0;
  unique0x10000c40 = in_RDX;
  fileReaderFactory_local = fileReaderFactory;
  Options_local = Options;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(fileReaderFactory + 1));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar2,&local_49);
  ASDCP::EssenceType((string *)Options,(EssenceType_t *)local_48,(IFileReaderFactory *)local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  __stream = _stderr;
  if (-1 < iVar1) {
    if (local_24._0_4_ == 9) {
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::FileInfoWrapper
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348,
                 stack0xffffffffffffffe0);
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::file_info
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)
                 &stack0xfffffffffffffc50,(CommandOptions *)local_348,
                 (char *)fileReaderFactory_local,(FILE *)"JPEG 2000 pictures");
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&stack0xfffffffffffffc50);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xfffffffffffffc50);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::get_PictureEssenceCoding
                  ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348,
                   (FILE *)0x0);
        FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::calc_Bitrate
                  ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348,
                   (FILE *)_stdout);
        if (((ulong)fileReaderFactory_local[4]._vptr_IFileReaderFactory & 0x100000000) != 0) {
          FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::dump_PictureEssenceCoding
                    ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348,
                     (FILE *)_stdout);
        }
        if (((ulong)fileReaderFactory_local[4]._vptr_IFileReaderFactory & 0x10000000000) != 0) {
          FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::dump_Bitrate
                    ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348,
                     (FILE *)_stdout);
        }
        FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::test_rates
                  ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)
                   (wrapper_1.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf),
                   (CommandOptions *)local_348,(FILE *)fileReaderFactory_local);
        Kumu::Result_t::operator=
                  ((Result_t *)Options,
                   (Result_t *)
                   (wrapper_1.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf));
        Kumu::Result_t::~Result_t
                  ((Result_t *)
                   (wrapper_1.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf));
      }
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::~FileInfoWrapper
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_348);
    }
    else if (local_24._0_4_ == 0xe) {
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::FileInfoWrapper
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8,
                 stack0xffffffffffffffe0);
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::file_info
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_650,
                 (CommandOptions *)local_5e8,(char *)fileReaderFactory_local,(FILE *)"ACES pictures"
                );
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_650);
      Kumu::Result_t::~Result_t((Result_t *)local_650);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::get_PictureEssenceCoding
                  ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8,
                   (FILE *)0x0);
        FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::calc_Bitrate
                  ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8,
                   (FILE *)_stdout);
        if (((ulong)fileReaderFactory_local[4]._vptr_IFileReaderFactory & 0x100000000) != 0) {
          FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::
          dump_PictureEssenceCoding
                    ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8,
                     (FILE *)_stdout);
        }
        if (((ulong)fileReaderFactory_local[4]._vptr_IFileReaderFactory & 0x10000000000) != 0) {
          FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::dump_Bitrate
                    ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8,
                     (FILE *)_stdout);
        }
        FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::test_rates
                  ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)
                   (wrapper_2.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf),
                   (CommandOptions *)local_5e8,(FILE *)fileReaderFactory_local);
        Kumu::Result_t::operator=
                  ((Result_t *)Options,
                   (Result_t *)
                   (wrapper_2.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf));
        Kumu::Result_t::~Result_t
                  ((Result_t *)
                   (wrapper_2.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf));
      }
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::~FileInfoWrapper
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_5e8);
    }
    else if ((local_24._0_4_ == 10) || (local_24._0_4_ == 0xb)) {
      FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::FileInfoWrapper
                ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_800,
                 stack0xffffffffffffffe0);
      FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::file_info
                ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)
                 (wrapper_3.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf),
                 (CommandOptions *)local_800,(char *)fileReaderFactory_local,(FILE *)"PCM audio");
      Kumu::Result_t::operator=
                ((Result_t *)Options,
                 (Result_t *)(wrapper_3.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf))
      ;
      Kumu::Result_t::~Result_t
                ((Result_t *)(wrapper_3.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf))
      ;
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar1) &&
         (((ulong)fileReaderFactory_local[4]._vptr_IFileReaderFactory & 0x100000000) != 0)) {
        FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::dump_WaveAudioDescriptor
                  ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_800,
                   (FILE *)_stdout);
      }
      FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::~FileInfoWrapper
                ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_800);
    }
    else if (local_24._0_4_ == 0x10) {
      FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::FileInfoWrapper
                ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)local_9a0,
                 stack0xffffffffffffffe0);
      FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::file_info
                ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)
                 (wrapper_4.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf),
                 (CommandOptions *)local_9a0,(char *)fileReaderFactory_local,(FILE *)"JPEG XS");
      Kumu::Result_t::operator=
                ((Result_t *)Options,
                 (Result_t *)(wrapper_4.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf))
      ;
      Kumu::Result_t::~Result_t
                ((Result_t *)(wrapper_4.m_PictureEssenceCoding.super_Identifier<16U>.m_Value + 0xf))
      ;
      FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::~FileInfoWrapper
                ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)local_9a0);
    }
    else if (local_24._0_4_ == 0xf) {
      FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::FileInfoWrapper
                ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_b38,
                 stack0xffffffffffffffe0);
      FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::file_info
                ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)&Reader,
                 (CommandOptions *)local_b38,(char *)fileReaderFactory_local,(FILE *)"IAB audio");
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Reader);
      Kumu::Result_t::~Result_t((Result_t *)&Reader);
      FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::~FileInfoWrapper
                ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_b38);
    }
    else {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(fileReaderFactory_local + 1));
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Unknown/unsupported essence type: %s\n",uVar3);
      iVar1 = (**stack0xffffffffffffffe0->_vptr_IFileReaderFactory)();
      ASDCP::mem_ptr<Kumu::IFileReader>::mem_ptr
                ((mem_ptr<Kumu::IFileReader> *)&Dict,(IFileReader *)CONCAT44(extraout_var,iVar1));
      pDVar4 = (Dictionary *)ASDCP::DefaultCompositeDict();
      ASDCP::MXF::OP1aHeader::OP1aHeader((OP1aHeader *)local_dc8,pDVar4);
      pIVar5 = ASDCP::mem_ptr<Kumu::IFileReader>::operator->((mem_ptr<Kumu::IFileReader> *)&Dict);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(fileReaderFactory_local + 1));
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e50,pcVar2,&local_e51);
      (**(code **)(*(long *)pIVar5 + 0x10))(local_e30,pIVar5,local_e50);
      Kumu::Result_t::operator=((Result_t *)Options,local_e30);
      Kumu::Result_t::~Result_t(local_e30);
      std::__cxx11::string::~string(local_e50);
      std::allocator<char>::~allocator(&local_e51);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        ASDCP::mem_ptr<Kumu::IFileReader>::operator*((mem_ptr<Kumu::IFileReader> *)&Dict);
        ASDCP::MXF::OP1aHeader::InitFromFile((IFileReader *)&ID);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&ID);
        Kumu::Result_t::~Result_t((Result_t *)&ID);
      }
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (iVar1 < 0) {
        fputs("File is not MXF.\n",_stdout);
      }
      else {
        ASDCP::MXF::Partition::Dump((_IO_FILE *)local_dc8);
        plVar6 = (long *)ASDCP::MXF::OP1aHeader::GetIdentification();
        if (plVar6 == (long *)0x0) {
          fputs("File contains no Identification object.\n",_stdout);
        }
        else {
          (**(code **)(*plVar6 + 0x88))(plVar6,_stdout);
        }
        plVar6 = (long *)ASDCP::MXF::OP1aHeader::GetSourcePackage();
        if (plVar6 == (long *)0x0) {
          fputs("File contains no SourcePackage object.\n",_stdout);
        }
        else {
          (**(code **)(*plVar6 + 0x88))(plVar6,_stdout);
        }
      }
      ASDCP::MXF::OP1aHeader::~OP1aHeader((OP1aHeader *)local_dc8);
      ASDCP::mem_ptr<Kumu::IFileReader>::~mem_ptr((mem_ptr<Kumu::IFileReader> *)&Dict);
    }
  }
  return Options;
}

Assistant:

Result_t
show_file_info(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  EssenceType_t EssenceType;
  Result_t result = ASDCP::EssenceType(Options.filenames.front().c_str(), EssenceType, fileReaderFactory);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( EssenceType == ESS_AS02_JPEG_2000 )
    {
	  FileInfoWrapper<AS_02::JP2K::MXFReader, MyPictureDescriptor> wrapper(fileReaderFactory);
	  result = wrapper.file_info(Options, "JPEG 2000 pictures");

	  if ( KM_SUCCESS(result) )
	    {
	      wrapper.get_PictureEssenceCoding();
	      wrapper.calc_Bitrate(stdout);

	      if ( Options.showcoding_flag )
		{
		  wrapper.dump_PictureEssenceCoding(stdout);
		}

	      if ( Options.showrate_flag )
		{
		  wrapper.dump_Bitrate(stdout);
		}

	      result = wrapper.test_rates(Options, stdout);
	    }
    }

  else if ( EssenceType == ESS_AS02_ACES )
    {
	  FileInfoWrapper<AS_02::ACES::MXFReader, MyACESPictureDescriptor> wrapper(fileReaderFactory);
	  result = wrapper.file_info(Options, "ACES pictures");

	  if ( KM_SUCCESS(result) )
	    {
	      wrapper.get_PictureEssenceCoding();
	      wrapper.calc_Bitrate(stdout);

	      if ( Options.showcoding_flag )
		{
		  wrapper.dump_PictureEssenceCoding(stdout);
		}

	      if ( Options.showrate_flag )
		{
		  wrapper.dump_Bitrate(stdout);
		}

	      result = wrapper.test_rates(Options, stdout);
	    }
    }

  else if ( EssenceType == ESS_AS02_PCM_24b_48k || EssenceType == ESS_AS02_PCM_24b_96k )
    {
      FileInfoWrapper<AS_02::PCM::MXFReader, MyAudioDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "PCM audio");

      if ( ASDCP_SUCCESS(result) && Options.showcoding_flag )
	wrapper.dump_WaveAudioDescriptor(stdout);
    }
  else if ( EssenceType == ESS_AS02_JPEG_XS )
    {
      FileInfoWrapper<AS_02::JXS::MXFReader, MyJXSDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "JPEG XS");
    }
  else if ( EssenceType == ESS_AS02_IAB )
    {
      FileInfoWrapper<AS_02::IAB::MXFReader, MyIabDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "IAB audio");
    }
  else
    {
      fprintf(stderr, "Unknown/unsupported essence type: %s\n", Options.filenames.front().c_str());
      ASDCP::mem_ptr<Kumu::IFileReader> Reader(fileReaderFactory.CreateFileReader());
      const Dictionary* Dict = &DefaultCompositeDict();
      MXF::OP1aHeader TestHeader(Dict);

      result = Reader->OpenRead(Options.filenames.front().c_str());

      if ( ASDCP_SUCCESS(result) )
	    result = TestHeader.InitFromFile(*Reader); // test UL and OP

      if ( ASDCP_SUCCESS(result) )
	{
	  TestHeader.Partition::Dump(stdout);

	  if ( MXF::Identification* ID = TestHeader.GetIdentification() )
	    ID->Dump(stdout);
	  else
	    fputs("File contains no Identification object.\n", stdout);

	  if ( MXF::SourcePackage* SP = TestHeader.GetSourcePackage() )
	    SP->Dump(stdout);
	  else
	    fputs("File contains no SourcePackage object.\n", stdout);
	}
      else
	{
	  fputs("File is not MXF.\n", stdout);
	}
    }  
  return result;
}